

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O1

uint64_t Imf_3_2::anon_unknown_7::writeLineOffsets
                   (OStream *os,vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  long *local_50 [2];
  long local_40 [2];
  
  iVar2 = (*os->_vptr_OStream[3])();
  if (CONCAT44(extraout_var,iVar2) == 0xffffffffffffffff) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Cannot determine current file position (%T).","");
    Iex_3_2::throwErrnoExc((string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  puVar3 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      local_50[0] = (long *)puVar3[uVar4];
      (*os->_vptr_OStream[2])(os,local_50,8);
      puVar3 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar5 < (ulong)((long)(lineOffsets->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)
      ;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

uint64_t
writeLineOffsets (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const vector<uint64_t>&                  lineOffsets)
{
    uint64_t pos = os.tellp ();

    if (pos == static_cast<uint64_t> (-1))
        IEX_NAMESPACE::throwErrnoExc (
            "Cannot determine current file position (%T).");

    for (unsigned int i = 0; i < lineOffsets.size (); i++)
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, lineOffsets[i]);

    return pos;
}